

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O1

wchar_t cleanup_pathname_fsobj(char *path,wchar_t *a_eno,archive_string *a_estr,wchar_t flags)

{
  byte bVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  byte *pbVar5;
  byte *pbVar6;
  long lVar8;
  byte *pbVar7;
  
  pbVar5 = (byte *)path;
  if (*path == '/') {
    if (((uint)flags >> 0x10 & 1) == 0) {
      pbVar6 = (byte *)(path + 1);
      cVar2 = '/';
      goto LAB_00477f5e;
    }
    if (a_eno != (wchar_t *)0x0) {
      *a_eno = L'\xffffffff';
    }
    if (a_estr == (archive_string *)0x0) {
      return L'\xffffffe7';
    }
    pcVar3 = "Path is ";
    pcVar4 = "absolute";
  }
  else {
    if (*path != '\0') {
      cVar2 = '\0';
      pbVar6 = (byte *)path;
LAB_00477f5e:
      do {
        while (bVar1 = *pbVar6, bVar1 != 0x2e) {
          lVar8 = 1;
          if (bVar1 == 0x2f) goto LAB_00477f8c;
          if (bVar1 == 0) goto LAB_00477fdc;
LAB_00477fb2:
          pbVar7 = pbVar6;
          if (cVar2 == '\0') goto LAB_00477fbc;
          *pbVar5 = 0x2f;
          while( true ) {
            pbVar5 = pbVar5 + 1;
            pbVar7 = pbVar6;
LAB_00477fbc:
            pbVar6 = pbVar7 + 1;
            bVar1 = *pbVar7;
            if (bVar1 == 0) goto LAB_00477fdc;
            if (bVar1 == 0x2f) break;
            *pbVar5 = bVar1;
          }
          cVar2 = '/';
        }
        bVar1 = pbVar6[1];
        lVar8 = 2;
        if (bVar1 != 0x2f) {
          if (bVar1 != 0) {
            if ((bVar1 != 0x2e) ||
               (((pbVar6[2] != 0x2f && (pbVar6[2] != 0)) || (((uint)flags >> 9 & 1) == 0))))
            goto LAB_00477fb2;
            if (a_eno != (wchar_t *)0x0) {
              *a_eno = L'\xffffffff';
            }
            if (a_estr == (archive_string *)0x0) {
              return L'\xffffffe7';
            }
            pcVar3 = "Path contains ";
            pcVar4 = "\'..\'";
            goto LAB_00478020;
          }
LAB_00477fdc:
          if (pbVar5 == (byte *)path) {
            *pbVar5 = cVar2 == '\0' ^ 0x2f;
            pbVar5 = pbVar5 + 1;
          }
          *pbVar5 = 0;
          return L'\0';
        }
LAB_00477f8c:
        pbVar6 = pbVar6 + lVar8;
      } while( true );
    }
    if (a_eno != (wchar_t *)0x0) {
      *a_eno = L'\xffffffff';
    }
    if (a_estr == (archive_string *)0x0) {
      return L'\xffffffe7';
    }
    pcVar3 = "Invalid empty ";
    pcVar4 = "pathname";
  }
LAB_00478020:
  archive_string_sprintf(a_estr,"%s%s",pcVar3,pcVar4);
  return L'\xffffffe7';
}

Assistant:

static int
cleanup_pathname_fsobj(char *path, int *a_eno, struct archive_string *a_estr,
    int flags)
{
	char *dest, *src;
	char separator = '\0';

	dest = src = path;
	if (*src == '\0') {
		fsobj_error(a_eno, a_estr, ARCHIVE_ERRNO_MISC,
		    "Invalid empty ", "pathname");
		return (ARCHIVE_FAILED);
	}

#if defined(__CYGWIN__)
	cleanup_pathname_win(path);
#endif
	/* Skip leading '/'. */
	if (*src == '/') {
		if (flags & ARCHIVE_EXTRACT_SECURE_NOABSOLUTEPATHS) {
			fsobj_error(a_eno, a_estr, ARCHIVE_ERRNO_MISC,
			    "Path is ", "absolute");
			return (ARCHIVE_FAILED);
		}

		separator = *src++;
	}

	/* Scan the pathname one element at a time. */
	for (;;) {
		/* src points to first char after '/' */
		if (src[0] == '\0') {
			break;
		} else if (src[0] == '/') {
			/* Found '//', ignore second one. */
			src++;
			continue;
		} else if (src[0] == '.') {
			if (src[1] == '\0') {
				/* Ignore trailing '.' */
				break;
			} else if (src[1] == '/') {
				/* Skip './'. */
				src += 2;
				continue;
			} else if (src[1] == '.') {
				if (src[2] == '/' || src[2] == '\0') {
					/* Conditionally warn about '..' */
					if (flags
					    & ARCHIVE_EXTRACT_SECURE_NODOTDOT) {
						fsobj_error(a_eno, a_estr,
						    ARCHIVE_ERRNO_MISC,
						    "Path contains ", "'..'");
						return (ARCHIVE_FAILED);
					}
				}
				/*
				 * Note: Under no circumstances do we
				 * remove '..' elements.  In
				 * particular, restoring
				 * '/foo/../bar/' should create the
				 * 'foo' dir as a side-effect.
				 */
			}
		}

		/* Copy current element, including leading '/'. */
		if (separator)
			*dest++ = '/';
		while (*src != '\0' && *src != '/') {
			*dest++ = *src++;
		}

		if (*src == '\0')
			break;

		/* Skip '/' separator. */
		separator = *src++;
	}
	/*
	 * We've just copied zero or more path elements, not including the
	 * final '/'.
	 */
	if (dest == path) {
		/*
		 * Nothing got copied.  The path must have been something
		 * like '.' or '/' or './' or '/././././/./'.
		 */
		if (separator)
			*dest++ = '/';
		else
			*dest++ = '.';
	}
	/* Terminate the result. */
	*dest = '\0';
	return (ARCHIVE_OK);
}